

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bsdcat.c
# Opt level: O1

int main(int argc,char **argv)

{
  FILE *pFVar1;
  int iVar2;
  char *pcVar3;
  
  lafe_setprogname(*argv,"bsdcat");
  iVar2 = getopt(argc,argv,"h-");
  if (iVar2 == -1) {
    bsdcat_next();
    if (_optind < argc) {
      while (_optind < argc) {
        bsdcat_current_path = argv[_optind];
        _optind = _optind + 1;
        bsdcat_read_to_stdout(bsdcat_current_path);
        bsdcat_next();
      }
    }
    else {
      bsdcat_current_path = "<stdin>";
      bsdcat_read_to_stdout((char *)0x0);
    }
    exit(exit_status);
  }
  if (iVar2 != 0x68) {
    if (iVar2 != 0x2d) {
LAB_00106844:
      pFVar1 = _stderr;
      pcVar3 = lafe_getprogname();
      fprintf(pFVar1,"Usage: %s [-h] [--help] [--version] [--] [filenames...]\n",pcVar3);
      exit(1);
    }
    pcVar3 = argv[_optind];
    iVar2 = strcmp(pcVar3,"--version");
    if (iVar2 == 0) {
      pcVar3 = archive_version_details();
      printf("bsdcat %s - %s\n","3.1.2",pcVar3);
      goto LAB_0010682a;
    }
    iVar2 = strcmp(pcVar3,"--help");
    if (iVar2 != 0) {
      lafe_warnc(0,"invalid option -- \'%s\'",pcVar3);
      goto LAB_00106844;
    }
  }
  pFVar1 = _stdout;
  pcVar3 = lafe_getprogname();
  fprintf(pFVar1,"Usage: %s [-h] [--help] [--version] [--] [filenames...]\n",pcVar3);
LAB_0010682a:
  exit(0);
}

Assistant:

int
main(int argc, char **argv)
{
	int c;

	lafe_setprogname(*argv, "bsdcat");

	while ((c = getopt(argc, argv, "h-")) != -1) {
		switch (c) {
			case '-':
				if (strcmp(argv[optind], "--version") == 0)
					version();
				if (strcmp(argv[optind], "--help") != 0) {
					lafe_warnc(0, "invalid option -- '%s'", argv[optind]);
					usage(stderr, 1);
				}
			case 'h':
				usage(stdout, 0);
			default:
				usage(stderr, 1);
		}
	}

	bsdcat_next();
	if (optind >= argc) {
		bsdcat_current_path = "<stdin>";
		bsdcat_read_to_stdout(NULL);
	} else
		while (optind < argc) {
			bsdcat_current_path = argv[optind++];
			bsdcat_read_to_stdout(bsdcat_current_path);
			bsdcat_next();
		}

	exit(exit_status);
}